

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::Read
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *this,TPZStream *str,void *context)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  TPZRefPattern *this_01;
  const_iterator this_02;
  long *in_RSI;
  TPZVec<long> *in_RDI;
  const_iterator it;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  *RefPatternList;
  int refpatternindex;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  _Self in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  _List_const_iterator<TPZAutoPointer<TPZRefPattern>_> local_30;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> *local_28;
  int local_1c [3];
  long *local_10;
  
  local_10 = in_RSI;
  TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::Read
            ((TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *)in_stack_ffffffffffffffc0._M_node,
             (TPZStream *)in_stack_ffffffffffffffb8._M_node,in_stack_ffffffffffffffb0._M_node);
  TPZStream::Read<long>((TPZStream *)in_stack_ffffffffffffffb0._M_node,in_RDI);
  (**(code **)(*local_10 + 0xe8))(local_10,local_1c,1);
  if (local_1c[0] != -1) {
    (*in_RDI->_vptr_TPZVec[0x17])();
    local_28 = TPZRefPatternDataBase::RefPatternList_abi_cxx11_
                         ((TPZRefPatternDataBase *)in_stack_ffffffffffffffb0._M_node,
                          (MElementType)((ulong)in_RDI >> 0x20));
    std::_List_const_iterator<TPZAutoPointer<TPZRefPattern>_>::_List_const_iterator(&local_30);
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::begin
                   ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)in_RDI);
    while( true ) {
      std::__cxx11::
      list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                  *)in_RDI);
      bVar1 = std::operator!=(&local_30,(_Self *)&stack0xffffffffffffffc0);
      if (!bVar1) break;
      this_00 = std::_List_const_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                          ((_List_const_iterator<TPZAutoPointer<TPZRefPattern>_> *)
                           in_stack_ffffffffffffffb0._M_node);
      this_01 = TPZAutoPointer<TPZRefPattern>::operator->(this_00);
      iVar2 = TPZRefPattern::Id(this_01);
      if (iVar2 == local_1c[0]) break;
      in_stack_ffffffffffffffb8 =
           std::_List_const_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(&local_30,0);
    }
    this_02 = std::__cxx11::
              list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
              end((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                   *)in_RDI);
    bVar1 = std::operator!=(&local_30,(_Self *)&stack0xffffffffffffffb0);
    if (bVar1) {
      std::_List_const_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                ((_List_const_iterator<TPZAutoPointer<TPZRefPattern>_> *)this_02._M_node);
      TPZAutoPointer<TPZRefPattern>::operator=
                ((TPZAutoPointer<TPZRefPattern> *)in_stack_ffffffffffffffb8._M_node,
                 (TPZAutoPointer<TPZRefPattern> *)this_02._M_node);
    }
    else {
      pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Read(TPZStream &str, void *context) {
    TPZGeoElRefLess<TGeo>::Read(str, context);
    str.Read(this->fSubEl);
    int refpatternindex;
    str.Read(&refpatternindex, 1);
    if (refpatternindex != -1) {
        const std::list< TPZAutoPointer<TPZRefPattern> > &RefPatternList = gRefDBase.RefPatternList(this->Type());
        std::list< TPZAutoPointer<TPZRefPattern> >::const_iterator it;

        for (it = RefPatternList.begin(); it != RefPatternList.end(); it++) {
            if ((*it)->Id() == refpatternindex) {
                break;
            }
        }

        if (it != RefPatternList.end()) {
            fRefPattern = *it;
        } else {
            DebugStop();
        }
    }
}